

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::BoundsAreResetOnRequest(VectorRasterizerTests *this)

{
  allocator local_d1;
  int local_d0 [2];
  string local_c8;
  LocationInfo local_a8;
  vector_rasterizer vr;
  
  vector_rasterizer::vector_rasterizer(&vr);
  vector_rasterizer::line(&vr,0xd00,0x1100,0xd80,0x11b3);
  vector_rasterizer::reset(&vr);
  local_d0[1] = 0;
  local_d0[0] = 0;
  if (vr._min_y <= vr._max_y) {
    local_d0[0] = (vr._max_x - vr._min_x) + 1;
  }
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0x6d);
  ut::are_equal<int,int>(local_d0 + 1,local_d0,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0[1] = 0;
  local_d0[0] = (vr._max_y - vr._min_y) + 1;
  if (vr._max_y < vr._min_y) {
    local_d0[0] = 0;
  }
  std::__cxx11::string::string
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_d1);
  ut::LocationInfo::LocationInfo(&local_a8,&local_c8,0x6e);
  ut::are_equal<int,int>(local_d0 + 1,local_d0,&local_a8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr);
  return;
}

Assistant:

test( BoundsAreResetOnRequest )
			{
				// INIT
				vector_rasterizer vr;

				vr.line(fp(13.0), fp(17.0), fp(13.5), fp(17.7));

				// ACT
				vr.reset();

				// ACT / ASSERT
				assert_equal(0, vr.width());
				assert_equal(0, vr.height());
			}